

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

void luaX_next(LexState *ls)

{
  undefined4 uVar1;
  int iVar2;
  LexState *ls_local;
  
  ls->lastline = ls->linenumber;
  if ((ls->lookahead).token == 0x122) {
    iVar2 = llex(ls,&(ls->t).seminfo);
    (ls->t).token = iVar2;
  }
  else {
    uVar1 = *(undefined4 *)&(ls->lookahead).field_0x4;
    (ls->t).token = (ls->lookahead).token;
    *(undefined4 *)&(ls->t).field_0x4 = uVar1;
    (ls->t).seminfo = (ls->lookahead).seminfo;
    (ls->lookahead).token = 0x122;
  }
  return;
}

Assistant:

void luaX_next (LexState *ls) {
  ls->lastline = ls->linenumber;
  if (ls->lookahead.token != TK_EOS) {  /* is there a look-ahead token? */
    ls->t = ls->lookahead;  /* use this one */
    ls->lookahead.token = TK_EOS;  /* and discharge it */
  }
  else
    ls->t.token = llex(ls, &ls->t.seminfo);  /* read next token */
}